

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O3

void __thiscall
Rml::FilterBasicInstancer::FilterBasicInstancer
          (FilterBasicInstancer *this,ValueType value_type,char *default_value)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_b1;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  FilterInstancer::FilterInstancer(&this->super_FilterInstancer);
  (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)&PTR__FilterInstancer_00330838
  ;
  (this->ids).value = Invalid;
  if (value_type == Angle) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"value","");
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,default_value,&local_b1);
    pPVar2 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_b0,&local_90
                       );
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"angle","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_50,&local_70);
    PVar1 = PropertyDefinition::GetId(pPVar2);
  }
  else {
    if (value_type != NumberPercent) goto LAB_00242c23;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"value","");
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,default_value,&local_b1);
    pPVar2 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_b0,&local_90
                       );
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number_percent","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_50,&local_70);
    PVar1 = PropertyDefinition::GetId(pPVar2);
  }
  (this->ids).value = PVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_00242c23:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"filter","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"value","");
  EffectSpecification::RegisterShorthand
            (&(this->super_FilterInstancer).super_EffectSpecification,&local_b0,&local_90,
             FallThrough);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FilterBasicInstancer::FilterBasicInstancer(ValueType value_type, const char* default_value)
{
	switch (value_type)
	{
	case ValueType::NumberPercent: ids.value = RegisterProperty("value", default_value).AddParser("number_percent").GetId(); break;
	case ValueType::Angle: ids.value = RegisterProperty("value", default_value).AddParser("angle").GetId(); break;
	}

	RegisterShorthand("filter", "value", ShorthandType::FallThrough);
}